

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int cpool_add(JSParseState *s,JSValue val)

{
  JSFunctionDef *pJVar1;
  JSValue *pJVar2;
  int iVar3;
  
  pJVar1 = s->cur_func;
  iVar3 = js_resize_array(s->ctx,&pJVar1->cpool,0x10,&pJVar1->cpool_size,pJVar1->cpool_count + 1);
  if (iVar3 == 0) {
    pJVar2 = pJVar1->cpool;
    iVar3 = pJVar1->cpool_count;
    pJVar1->cpool_count = iVar3 + 1;
    pJVar2[iVar3].u = val.u;
    pJVar2[iVar3].tag = val.tag;
    iVar3 = pJVar1->cpool_count + -1;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int cpool_add(JSParseState *s, JSValue val)
{
    JSFunctionDef *fd = s->cur_func;
    
    if (js_resize_array(s->ctx, (void *)&fd->cpool, sizeof(fd->cpool[0]),
                        &fd->cpool_size, fd->cpool_count + 1))
        return -1;
    fd->cpool[fd->cpool_count++] = val;
    return fd->cpool_count - 1;
}